

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vepu540c_common.c
# Opt level: O3

MPP_RET vepu540c_set_jpeg_reg(Vepu540cJpegCfg *cfg)

{
  uint uVar1;
  int *piVar2;
  void *pvVar3;
  uint *puVar4;
  uint *puVar5;
  MppDev pvVar6;
  int iVar7;
  MppFrameFormat MVar8;
  RK_U32 offset;
  RK_U32 RVar9;
  size_t sVar10;
  uint uVar11;
  undefined2 uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  
  piVar2 = (int *)cfg->jpeg_reg_base;
  pvVar3 = cfg->enc_task;
  puVar4 = *(uint **)((long)pvVar3 + 0x20);
  puVar5 = (uint *)cfg->input_fmt;
  uVar14 = *puVar4;
  uVar11 = puVar4[1];
  iVar7 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)((long)pvVar3 + 0x68),"vepu540c_set_jpeg_reg")
  ;
  piVar2[8] = iVar7;
  piVar2[9] = iVar7;
  piVar2[10] = iVar7;
  uVar13 = puVar4[3];
  if (uVar13 == 0) {
    uVar13 = puVar4[1];
  }
  uVar15 = puVar4[2];
  pvVar6 = cfg->dev;
  uVar1 = *puVar5;
  MVar8 = mpp_frame_get_fmt(*(MppFrame *)((long)pvVar3 + 0x60));
  if ((MVar8 & 0xf00000) != MPP_FMT_YUV420SP) {
    offset = mpp_frame_get_fbc_offset(*(MppFrame *)((long)pvVar3 + 0x60));
    _mpp_log_l(4,"vepu540c_common","fbc case u_offset = %d",(char *)0x0,(ulong)offset);
    RVar9 = 0;
    goto LAB_00263d87;
  }
  offset = uVar13 * uVar15;
  switch(uVar1) {
  case 0:
  case 1:
  case 2:
  case 8:
  case 9:
    goto switchD_00263ddc_caseD_0;
  default:
    _mpp_log_l(2,"vepu540c_common","unknown color space: %d\n",(char *)0x0);
  case 7:
    RVar9 = offset * 5 >> 2;
    break;
  case 4:
  case 6:
    RVar9 = offset;
    break;
  case 5:
    RVar9 = offset * 3 >> 1;
  }
LAB_00263d87:
  if (offset != 0) {
    mpp_dev_set_reg_offset(pvVar6,0x109,offset);
  }
  if (RVar9 != 0) {
    mpp_dev_set_reg_offset(pvVar6,0x10a,RVar9);
  }
switchD_00263ddc_caseD_0:
  iVar7 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)((long)pvVar3 + 0x40),"vepu540c_set_jpeg_reg")
  ;
  *piVar2 = iVar7;
  piVar2[1] = iVar7;
  piVar2[2] = iVar7;
  piVar2[3] = iVar7;
  pvVar6 = cfg->dev;
  sVar10 = mpp_packet_get_length(*(MppPacket *)((long)pvVar3 + 0x38));
  mpp_dev_set_reg_offset(pvVar6,0x102,(RK_U32)sVar10);
  pvVar6 = cfg->dev;
  sVar10 = mpp_buffer_get_size_with_caller
                     (*(MppBuffer *)((long)pvVar3 + 0x40),"vepu540c_set_jpeg_reg");
  mpp_dev_set_reg_offset(pvVar6,0x100,(RK_U32)sVar10);
  uVar15 = (uVar14 + 7 >> 3) - 1 & 0x7ff;
  uVar14 = piVar2[0x10];
  piVar2[0x10] = uVar14 & 0xfffff800 | uVar15;
  uVar13 = 8 - (*puVar4 & 7);
  if ((*puVar4 & 7) == 0) {
    uVar13 = 0;
  }
  uVar1 = piVar2[0x12];
  uVar13 = piVar2[0x11] & 0xffffffc0U | uVar13;
  piVar2[0x11] = uVar13;
  piVar2[0x10] = uVar14 & 0xf800f800 | uVar15 | uVar11 * 0x2000 + 0x7ffe000 & 0x7ff0000;
  uVar14 = (puVar4[1] & 7) * -0x10000 + 0x80000;
  if ((puVar4[1] & 7) == 0) {
    uVar14 = 0;
  }
  piVar2[0x11] = uVar13 & 0xffc0ffcf | uVar14;
  uVar14 = *puVar5;
  uVar13 = uVar14 * 4 & 0x3c;
  piVar2[0x12] = uVar1 & 0xffffffc3 | uVar13;
  uVar11 = puVar5[1];
  piVar2[0x12] = uVar1 & 0xffffffc2 | uVar13 | uVar11 & 1;
  piVar2[0x12] = (uVar1 & 0xfffff840 | uVar13 | uVar11 & 1) + (puVar5[2] & 1) * 2 + 0x80;
  uVar11 = piVar2[0x17];
  piVar2[0x17] = uVar11 & 0xfbffffff;
  piVar2[0x17] = uVar11 & 0xe3ffffff | (puVar4[0xc] & 3) << 0x1b;
  uVar11 = puVar4[2];
  uVar14 = uVar14 & 0xf;
  if (uVar11 != 0) goto switchD_00263f50_caseD_3;
  uVar11 = 0;
  switch(uVar14) {
  case 0:
    uVar11 = *puVar4 << 2;
    break;
  case 1:
    uVar11 = *puVar4 * 3;
    break;
  case 2:
  case 8:
  case 9:
    uVar11 = *puVar4 * 2;
  default:
switchD_00263f50_caseD_3:
    uVar12 = (undefined2)uVar11;
    if ((uVar14 | 2) == 6) goto LAB_00263f6a;
  }
  uVar12 = (undefined2)((int)uVar11 / 2);
LAB_00263f6a:
  if (uVar13 < 0xc) {
    *(ulong *)(piVar2 + 0x13) = *(ulong *)(piVar2 + 0x13) & 0xf8000000f8000000 | 0x76b6c7001090219;
    *(ulong *)(piVar2 + 0x15) = *(ulong *)(piVar2 + 0x15) & 0xffe00000f8000000 | 0x10808001c345ee;
  }
  piVar2[0x19] = piVar2[0x19] & 0xfffe0000U | uVar11 & 0x1ffff;
  *(undefined2 *)(piVar2 + 0x1a) = uVar12;
  RVar9 = mpp_frame_get_offset_y(*(MppFrame *)((long)pvVar3 + 0x60));
  piVar2[0x18] = piVar2[0x18] & 0xc000ffffU | (RVar9 & 0x3fff) << 0x10;
  RVar9 = mpp_frame_get_offset_x(*(MppFrame *)((long)pvVar3 + 0x60));
  piVar2[0x18] = piVar2[0x18] & 0xffffc000U | RVar9 & 0x3fff;
  *(ulong *)(piVar2 + 0x1c) = *(ulong *)(piVar2 + 0x1c) & 0xffff8000ffff8000;
  piVar2[0x1e] = piVar2[0x1e] & 0xffff8000;
  piVar2[0x1f] = -0x60000000;
  piVar2[0x20] = piVar2[0x20] & 0xc0000000;
  return MPP_OK;
}

Assistant:

MPP_RET vepu540c_set_jpeg_reg(Vepu540cJpegCfg *cfg)
{
    HalEncTask *task = ( HalEncTask *)cfg->enc_task;
    JpegeSyntax *syn = (JpegeSyntax *)task->syntax.data;
    Vepu540cJpegReg *regs = (Vepu540cJpegReg *)cfg->jpeg_reg_base;
    VepuFmtCfg *fmt = (VepuFmtCfg *)cfg->input_fmt;
    RK_U32 pic_width_align8, pic_height_align8;
    RK_S32 stridey = 0;
    RK_S32 stridec = 0;

    pic_width_align8 = (syn->width + 7) & (~7);
    pic_height_align8 = (syn->height + 7) & (~7);

    regs->reg0264_adr_src0 =  mpp_buffer_get_fd(task->input);
    regs->reg0265_adr_src1 = regs->reg0264_adr_src0;
    regs->reg0266_adr_src2 = regs->reg0264_adr_src0;

    vepu540c_jpeg_set_patch_info(cfg->dev, syn, (Vepu541Fmt) fmt->format, task);

    regs->reg0256_adr_bsbt = mpp_buffer_get_fd(task->output);
    regs->reg0257_adr_bsbb = regs->reg0256_adr_bsbt;
    regs->reg0258_adr_bsbs = regs->reg0256_adr_bsbt;
    regs->reg0259_adr_bsbr = regs->reg0256_adr_bsbt;

    mpp_dev_set_reg_offset(cfg->dev, 258, mpp_packet_get_length(task->packet));
    mpp_dev_set_reg_offset(cfg->dev, 256, mpp_buffer_get_size(task->output));

    regs->reg0272_enc_rsl.pic_wd8_m1    = pic_width_align8 / 8 - 1;
    regs->reg0273_src_fill.pic_wfill    = (syn->width & 0x7)
                                          ? (8 - (syn->width & 0x7)) : 0;
    regs->reg0272_enc_rsl.pic_hd8_m1    = pic_height_align8 / 8 - 1;
    regs->reg0273_src_fill.pic_hfill    = (syn->height & 0x7)
                                          ? (8 - (syn->height & 0x7)) : 0;

    regs->reg0274_src_fmt.src_cfmt = fmt->format;
    regs->reg0274_src_fmt.alpha_swap = fmt->alpha_swap;
    regs->reg0274_src_fmt.rbuv_swap  = fmt->rbuv_swap;
    regs->reg0274_src_fmt.src_range_trns_en  = 0;
    regs->reg0274_src_fmt.src_range_trns_sel = 0;
    regs->reg0274_src_fmt.chroma_ds_mode     = 0;
    regs->reg0274_src_fmt.out_fmt = 1;

    regs->reg0279_src_proc.src_mirr = 0 ;//prep_cfg->mirroring > 0;
    regs->reg0279_src_proc.src_rot = syn->rotation;

    if (syn->hor_stride) {
        stridey = syn->hor_stride;
    } else {
        if (regs->reg0274_src_fmt.src_cfmt == VEPU541_FMT_BGRA8888 )
            stridey = syn->width * 4;
        else if (regs->reg0274_src_fmt.src_cfmt == VEPU541_FMT_BGR888 )
            stridey = syn->width * 3;
        else if (regs->reg0274_src_fmt.src_cfmt == VEPU541_FMT_BGR565 ||
                 regs->reg0274_src_fmt.src_cfmt == VEPU541_FMT_YUYV422 ||
                 regs->reg0274_src_fmt.src_cfmt == VEPU541_FMT_UYVY422)
            stridey = syn->width * 2;
    }

    stridec = (regs->reg0274_src_fmt.src_cfmt == VEPU541_FMT_YUV422SP ||
               regs->reg0274_src_fmt.src_cfmt == VEPU541_FMT_YUV420SP) ?
              stridey : stridey / 2;

    if (regs->reg0274_src_fmt.src_cfmt < VEPU541_FMT_NONE) {
        regs->reg0275_src_udfy.csc_wgt_r2y = 66;
        regs->reg0275_src_udfy.csc_wgt_g2y = 129;
        regs->reg0275_src_udfy.csc_wgt_b2y = 25;

        regs->reg0276_src_udfu.csc_wgt_r2u = -38;
        regs->reg0276_src_udfu.csc_wgt_g2u = -74;
        regs->reg0276_src_udfu.csc_wgt_b2u = 112;

        regs->reg0277_src_udfv.csc_wgt_r2v = 112;
        regs->reg0277_src_udfv.csc_wgt_g2v = -94;
        regs->reg0277_src_udfv.csc_wgt_b2v = -18;

        regs->reg0278_src_udfo.csc_ofst_y = 16;
        regs->reg0278_src_udfo.csc_ofst_u = 128;
        regs->reg0278_src_udfo.csc_ofst_v = 128;
    }
    regs->reg0281_src_strd0.src_strd0  = stridey;
    regs->reg0282_src_strd1.src_strd1  = stridec;
    regs->reg0280_pic_ofst.pic_ofst_y = mpp_frame_get_offset_y(task->frame);
    regs->reg0280_pic_ofst.pic_ofst_x = mpp_frame_get_offset_x(task->frame);
    //to be done

    // no 0283 ?
    // regs->reg0283_src_flt.pp_corner_filter_strength = 0;
    // regs->reg0283_src_flt.pp_edge_filter_strength = 0;
    // regs->reg0283_src_flt.pp_internal_filter_strength = 0;

    regs->reg0284_y_cfg.bias_y = 0;
    regs->reg0285_u_cfg.bias_u = 0;
    regs->reg0286_v_cfg.bias_v = 0;

    regs->reg0287_base_cfg.jpeg_ri  = 0;
    regs->reg0287_base_cfg.jpeg_out_mode = 0;
    regs->reg0287_base_cfg.jpeg_start_rst_m = 0;
    regs->reg0287_base_cfg.jpeg_pic_last_ecs = 1;
    regs->reg0287_base_cfg.jpeg_slen_fifo = 0;
    regs->reg0287_base_cfg.jpeg_stnd = 1; //enable

    regs->reg0288_uvc_cfg.uvc_partition0_len = 0;
    regs->reg0288_uvc_cfg.uvc_partition_len = 0;
    regs->reg0288_uvc_cfg.uvc_skip_len = 0;
    return MPP_OK;
}